

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_act.c
# Opt level: O0

bool redit_name(CHAR_DATA *ch,char *argument)

{
  char *pcVar1;
  CHAR_DATA *in_RSI;
  char *in_RDI;
  bool bVar2;
  ROOM_INDEX_DATA *pRoom;
  char *pstr;
  
  pstr = *(char **)(in_RDI + 0xa8);
  bVar2 = *(char *)&in_RSI->next != '\0';
  if (bVar2) {
    free_pstring(pstr);
    pcVar1 = palloc_string((char *)pRoom);
    *(char **)(pstr + 0x110) = pcVar1;
    send_to_char(in_RDI,in_RSI);
  }
  else {
    send_to_char(in_RDI,in_RSI);
  }
  return bVar2;
}

Assistant:

bool redit_name(CHAR_DATA *ch, char *argument)
{
	ROOM_INDEX_DATA *pRoom;

	EDIT_ROOM(ch, pRoom);

	if (argument[0] == '\0')
	{
		send_to_char("Syntax:  name [name]\n\r", ch);
		return false;
	}

	free_pstring(pRoom->name);
	pRoom->name = palloc_string(argument);

	send_to_char("Name set.\n\r", ch);
	return true;
}